

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

string * __thiscall
cmQtAutoMocUic::AbsoluteIncludePath
          (string *__return_storage_ptr__,cmQtAutoMocUic *this,string *relativePath)

{
  BaseSettingsT *pBVar1;
  string *relativePath_local;
  cmQtAutoMocUic *this_local;
  string *res;
  
  pBVar1 = BaseConst(this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&pBVar1->AutogenIncludeDir);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)relativePath);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoMocUic::AbsoluteIncludePath(
  std::string const& relativePath) const
{
  std::string res(BaseConst().AutogenIncludeDir);
  res += '/';
  res += relativePath;
  return res;
}